

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

optional<long> __thiscall
anon_unknown.dwarf_57b9211::MultiADescriptor::ScriptSize(MultiADescriptor *this)

{
  pointer puVar1;
  pointer puVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  long lVar4;
  long in_FS_OFFSET;
  optional<long> oVar5;
  direct_or_indirect local_40;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (this->super_DescriptorImpl).m_pubkey_args.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->super_DescriptorImpl).m_pubkey_args.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  BuildScript<int_const&>((CScript *)&local_40.indirect_contents,&this->m_threshold);
  uVar3 = extraout_RDX;
  if (0x1c < local_24) {
    local_24 = local_24 - 0x1d;
    free(local_40.indirect_contents.indirect);
    local_40.indirect_contents.indirect = (char *)0x0;
    uVar3 = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    lVar4 = (long)puVar2 - (long)puVar1;
    oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = (lVar4 >> 2) + lVar4 * 4 + (ulong)local_24 + 1;
    oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)uVar3 >> 8);
    oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = true;
    return (optional<long>)
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> ScriptSize() const override {
        const auto n_keys = m_pubkey_args.size();
        return (1 + 32 + 1) * n_keys + BuildScript(m_threshold).size() + 1;
    }